

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

int parse_args_DCL(Context *ctx)

{
  uint uVar1;
  RegisterType RVar2;
  uint *puVar3;
  char *pcVar4;
  byte bVar5;
  uint uVar6;
  uint32 uVar7;
  
  puVar3 = ctx->tokens;
  uVar1 = *puVar3;
  if (-1 < (int)uVar1) {
    failf(ctx,"%s","Bit #31 in DCL token must be one");
    puVar3 = ctx->tokens;
  }
  ctx->centroid_allowed = 1;
  ctx->tokens = puVar3 + 1;
  ctx->tokencount = ctx->tokencount - 1;
  ctx->current_position = ctx->current_position + 4;
  parse_destination_token(ctx,&ctx->dest_arg);
  ctx->centroid_allowed = 0;
  if ((ctx->dest_arg).result_shift != 0) {
    failf(ctx,"%s","shift scale in DCL");
  }
  if ((ctx->dest_arg).relative != 0) {
    failf(ctx,"%s","relative addressing in DCL");
  }
  RVar2 = (ctx->dest_arg).regtype;
  if (ctx->shader_type != MOJOSHADER_TYPE_VERTEX) {
    if (ctx->shader_type == MOJOSHADER_TYPE_PIXEL) {
      uVar7 = (ctx->dest_arg).regnum;
      if (ctx->major_ver < 3) {
        if (ctx->major_ver == 2) {
          if (RVar2 == REG_TYPE_SAMPLER) {
LAB_001130c0:
            uVar6 = uVar1 >> 0x1b & 0xf;
            if (uVar6 - 5 < 0xfffffffd) {
              failf(ctx,"%s","unknown sampler texture type");
            }
            ctx->dwords[0] = uVar6;
            uVar6 = 0x7ffffff;
            goto LAB_001131b8;
          }
          if (RVar2 == REG_TYPE_ADDRESS) {
            ctx->dwords[0] = 5;
          }
          else {
            if (RVar2 != REG_TYPE_INPUT) goto switchD_0011300d_caseD_2;
            ctx->dwords[0] = 10;
          }
          ctx->dwords[1] = uVar7;
LAB_0011317f:
          uVar6 = 0x7fffffff;
          goto LAB_001131b8;
        }
      }
      else if ((int)RVar2 < 10) {
        if (RVar2 == REG_TYPE_INPUT) goto switchD_0011300d_caseD_1;
        if (RVar2 == REG_TYPE_ADDRESS) {
          uVar7 = uVar1 >> 0x10 & 0xf;
          if ((uVar1 & 0xf) == 10) {
            if (uVar7 != 0) {
              pcVar4 = "DCL color usage must have 0 index";
              goto LAB_00113193;
            }
            goto LAB_001131a4;
          }
          goto LAB_00113151;
        }
      }
      else {
        if (RVar2 == REG_TYPE_SAMPLER) goto LAB_001130c0;
        if (RVar2 == REG_TYPE_MISCTYPE) {
          if (uVar7 != 0) {
            if (uVar7 != 1) {
              ctx->dwords[0] = 0xffffffff;
              ctx->dwords[1] = 0;
              goto switchD_0011300d_caseD_2;
            }
            if ((ctx->dest_arg).orig_writemask != 0xf) {
              failf(ctx,"%s","DCL face writemask must be full");
            }
            if ((ctx->dest_arg).result_mod != 0) {
              failf(ctx,"%s","DCL face result modifier must be zero");
            }
            if ((ctx->dest_arg).result_shift != 0) {
              failf(ctx,"%s","DCL face shift scale must be zero");
            }
          }
          ctx->dwords[0] = 0xffffffff;
          ctx->dwords[1] = 0;
          goto LAB_0011317f;
        }
      }
    }
switchD_0011300d_caseD_2:
    uVar6 = 0;
    failf(ctx,"%s","invalid DCL register type for this shader model");
    goto LAB_001131b8;
  }
  if (ctx->major_ver < 3) {
    bVar5 = 1;
    if (ctx->minor_ver != 0xff) {
      bVar5 = ctx->minor_ver;
    }
    if (RVar2 != REG_TYPE_INPUT || ((uint)bVar5 | (uint)ctx->major_ver << 0x10) < 0x10001)
    goto switchD_0011300d_caseD_2;
switchD_0011300d_caseD_1:
    ctx->dwords[0] = uVar1 & 0xf;
    ctx->dwords[1] = uVar1 >> 0x10 & 0xf;
  }
  else {
    switch(RVar2) {
    case REG_TYPE_INPUT:
    case REG_TYPE_OUTPUT:
      goto switchD_0011300d_caseD_1;
    default:
      goto switchD_0011300d_caseD_2;
    case REG_TYPE_ADDRESS:
      uVar7 = uVar1 >> 0x10 & 0xf;
      if ((uVar1 & 0xf) == 10) {
        if (uVar7 != 0) {
          pcVar4 = "DCL texcoord usage must have 0 index";
          goto LAB_00113193;
        }
      }
      else {
LAB_00113151:
        if ((uVar1 & 0xf) == 5) {
          if (uVar7 < 8) goto LAB_001131a4;
          pcVar4 = "DCL texcoord usage must have 0-7 index";
        }
        else {
          pcVar4 = "Invalid DCL texture usage";
        }
LAB_00113193:
        failf(ctx,"%s",pcVar4);
      }
LAB_001131a4:
      ctx->dwords[0] = uVar1 & 0xf;
      ctx->dwords[1] = uVar7;
      break;
    case REG_TYPE_SAMPLER:
      uVar6 = uVar1 >> 0x1b & 0xf;
      if (uVar6 - 5 < 0xfffffffd) {
        failf(ctx,"%s","Unknown sampler texture type");
      }
      ctx->dwords[0] = uVar6;
      uVar6 = 0x6fffffff;
      goto LAB_001131b8;
    }
  }
  uVar6 = 0x7ff0ffe0;
LAB_001131b8:
  if ((uVar6 & uVar1) != 0) {
    failf(ctx,"%s","reserved bits in DCL dword aren\'t zero");
  }
  return 3;
}

Assistant:

static int parse_args_DCL(Context *ctx)
{
    int unsupported = 0;
    const uint32 token = SWAP32(*(ctx->tokens));
    const int reserved1 = (int) ((token >> 31) & 0x1); // bit 31
    uint32 reserved_mask = 0x00000000;

    if (reserved1 != 0x1)
        fail(ctx, "Bit #31 in DCL token must be one");

    ctx->centroid_allowed = 1;
    adjust_token_position(ctx, 1);
    parse_destination_token(ctx, &ctx->dest_arg);
    ctx->centroid_allowed = 0;

    if (ctx->dest_arg.result_shift != 0)  // I'm pretty sure this is illegal...?
        fail(ctx, "shift scale in DCL");
    if (ctx->dest_arg.relative)  // I'm pretty sure this is illegal...?
        fail(ctx, "relative addressing in DCL");

    const RegisterType regtype = ctx->dest_arg.regtype;
    const int regnum = ctx->dest_arg.regnum;
    if ( (shader_is_pixel(ctx)) && (shader_version_atleast(ctx, 3, 0)) )
    {
        if (regtype == REG_TYPE_INPUT)
        {
            const uint32 usage = (token & 0xF);
            const uint32 index = ((token >> 16) & 0xF);
            reserved_mask = 0x7FF0FFE0;
            ctx->dwords[0] = usage;
            ctx->dwords[1] = index;
        } // if

        else if (regtype == REG_TYPE_MISCTYPE)
        {
            const MiscTypeType mt = (MiscTypeType) regnum;
            if (mt == MISCTYPE_TYPE_POSITION)
                reserved_mask = 0x7FFFFFFF;
            else if (mt == MISCTYPE_TYPE_FACE)
            {
                reserved_mask = 0x7FFFFFFF;
                if (!writemask_xyzw(ctx->dest_arg.orig_writemask))
                    fail(ctx, "DCL face writemask must be full");
                if (ctx->dest_arg.result_mod != 0)
                    fail(ctx, "DCL face result modifier must be zero");
                if (ctx->dest_arg.result_shift != 0)
                    fail(ctx, "DCL face shift scale must be zero");
            } // else if
            else
            {
                unsupported = 1;
            } // else

            ctx->dwords[0] = (uint32) MOJOSHADER_USAGE_UNKNOWN;
            ctx->dwords[1] = 0;
        } // else if

        else if (regtype == REG_TYPE_TEXTURE)
        {
            const uint32 usage = (token & 0xF);
            const uint32 index = ((token >> 16) & 0xF);
            if (usage == MOJOSHADER_USAGE_TEXCOORD)
            {
                if (index > 7)
                    fail(ctx, "DCL texcoord usage must have 0-7 index");
            } // if
            else if (usage == MOJOSHADER_USAGE_COLOR)
            {
                if (index != 0)
                    fail(ctx, "DCL color usage must have 0 index");
            } // else if
            else
            {
                fail(ctx, "Invalid DCL texture usage");
            } // else

            reserved_mask = 0x7FF0FFE0;
            ctx->dwords[0] = usage;
            ctx->dwords[1] = index;
        } // else if

        else if (regtype == REG_TYPE_SAMPLER)
        {
            const uint32 ttype = ((token >> 27) & 0xF);
            if (!valid_texture_type(ttype))
                fail(ctx, "unknown sampler texture type");
            reserved_mask = 0x7FFFFFF;
            ctx->dwords[0] = ttype;
        } // else if

        else
        {
            unsupported = 1;
        } // else
    } // if

    else if ( (shader_is_pixel(ctx)) && (shader_version_atleast(ctx, 2, 0)) )
    {
        if (regtype == REG_TYPE_INPUT)
        {
            ctx->dwords[0] = (uint32) MOJOSHADER_USAGE_COLOR;
            ctx->dwords[1] = regnum;
            reserved_mask = 0x7FFFFFFF;
        } // if
        else if (regtype == REG_TYPE_TEXTURE)
        {
            ctx->dwords[0] = (uint32) MOJOSHADER_USAGE_TEXCOORD;
            ctx->dwords[1] = regnum;
            reserved_mask = 0x7FFFFFFF;
        } // else if
        else if (regtype == REG_TYPE_SAMPLER)
        {
            const uint32 ttype = ((token >> 27) & 0xF);
            if (!valid_texture_type(ttype))
                fail(ctx, "unknown sampler texture type");
            reserved_mask = 0x7FFFFFF;
            ctx->dwords[0] = ttype;
        } // else if
        else
        {
            unsupported = 1;
        } // else
    } // if

    else if ( (shader_is_vertex(ctx)) && (shader_version_atleast(ctx, 3, 0)) )
    {
        if ((regtype == REG_TYPE_INPUT) || (regtype == REG_TYPE_OUTPUT))
        {
            const uint32 usage = (token & 0xF);
            const uint32 index = ((token >> 16) & 0xF);
            reserved_mask = 0x7FF0FFE0;
            ctx->dwords[0] = usage;
            ctx->dwords[1] = index;
        } // if
        else if (regtype == REG_TYPE_TEXTURE)
        {
            const uint32 usage = (token & 0xF);
            const uint32 index = ((token >> 16) & 0xF);
            if (usage == MOJOSHADER_USAGE_TEXCOORD)
            {
                if (index > 7)
                    fail(ctx, "DCL texcoord usage must have 0-7 index");
            } // if
            else if (usage == MOJOSHADER_USAGE_COLOR)
            {
                if (index != 0)
                    fail(ctx, "DCL texcoord usage must have 0 index");
            } // else if
            else
                fail(ctx, "Invalid DCL texture usage");

            reserved_mask = 0x7FF0FFE0;
            ctx->dwords[0] = usage;
            ctx->dwords[1] = index;
        } // else if
        else if (regtype == REG_TYPE_SAMPLER)
        {
            const uint32 ttype = ((token >> 27) & 0xF);
            if (!valid_texture_type(ttype))
                fail(ctx, "Unknown sampler texture type");
            reserved_mask = 0x6FFFFFFF;
            ctx->dwords[0] = ttype;
        } // else if
        else
        {
            unsupported = 1;
        } // else
    } // else if

    else if ( (shader_is_vertex(ctx)) && (shader_version_atleast(ctx, 1, 1)) )
    {
        if (regtype == REG_TYPE_INPUT)
        {
            const uint32 usage = (token & 0xF);
            const uint32 index = ((token >> 16) & 0xF);
            reserved_mask = 0x7FF0FFE0;
            ctx->dwords[0] = usage;
            ctx->dwords[1] = index;
        } // if
        else
        {
            unsupported = 1;
        } // else
    } // else if

    else
    {
        unsupported = 1;
    } // else

    if (unsupported)
        fail(ctx, "invalid DCL register type for this shader model");

    if ((token & reserved_mask) != 0)
        fail(ctx, "reserved bits in DCL dword aren't zero");

    return 3;
}